

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,TPZGeoBlend<pzgeom::TPZGeoPoint> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  TPZNodeRep<1,_pztopology::TPZPoint>::TPZNodeRep
            ((TPZNodeRep<1,_pztopology::TPZPoint> *)this,&PTR_PTR_0188edf8,
             (TPZNodeRep<1,_pztopology::TPZPoint> *)cp,gl2lcNdMap);
  (this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188ed98;
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_0187bb90;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please implement me\n",0x14);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x35);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp, std::map<int64_t, int64_t> &gl2lcNdMap) : TPZRegisterClassId(
                &TPZGeoBlend::ClassId), TGeo(cp, gl2lcNdMap) {
             std::cout << "Please implement me\n";
             DebugStop();
        }